

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O0

lua_Number lua_tonumberx(lua_State *L,int idx,int *isnum)

{
  TValue *local_40;
  TValue *o;
  TValue n;
  int *isnum_local;
  int idx_local;
  lua_State *L_local;
  
  n._8_8_ = isnum;
  local_40 = index2addr(L,idx);
  if ((local_40->tt_ != 3) &&
     (local_40 = luaV_tonumber(local_40,(TValue *)&o), local_40 == (TValue *)0x0)) {
    if (n._8_8_ != 0) {
      *(undefined4 *)n._8_8_ = 0;
    }
    return 0.0;
  }
  if (n._8_8_ != 0) {
    *(undefined4 *)n._8_8_ = 1;
  }
  return (lua_Number)(local_40->value_).gc;
}

Assistant:

LUA_API lua_Number lua_tonumberx (lua_State *L, int idx, int *isnum) {
  TValue n;
  const TValue *o = index2addr(L, idx);
  if (tonumber(o, &n)) {
    if (isnum) *isnum = 1;
    return nvalue(o);
  }
  else {
    if (isnum) *isnum = 0;
    return 0;
  }
}